

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

char * al_get_path_component(ALLEGRO_PATH *path,int i)

{
  char *pcVar1;
  ALLEGRO_USTR *us;
  
  if (i < 0) {
    pcVar1 = get_segment_cstr(path,i + (int)(path->segments)._size);
    return pcVar1;
  }
  us = get_segment(path,i);
  pcVar1 = al_cstr(us);
  return pcVar1;
}

Assistant:

const char *al_get_path_component(const ALLEGRO_PATH *path, int i)
{
   ASSERT(path);
   ASSERT(i < (int)_al_vector_size(&path->segments));

   if (i < 0)
      i = _al_vector_size(&path->segments) + i;

   ASSERT(i >= 0);

   return get_segment_cstr(path, i);
}